

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.cc
# Opt level: O1

shared_ptr<gutil::PropertyNode> * __thiscall
gutil::PropertyNode::getChild(PropertyNode *this,string *_name)

{
  vector<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
  *this_00;
  shared_ptr<gutil::PropertyNode> *psVar1;
  size_t __n;
  element_type *peVar2;
  PropertyNode *pPVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  shared_ptr<gutil::PropertyNode> *unaff_R15;
  bool bVar8;
  undefined1 local_59;
  string *local_58;
  PropertyNode *local_50;
  pointer local_48;
  shared_ptr<gutil::PropertyNode> local_40;
  
  psVar1 = (this->list).
           super__Vector_base<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(this->list).
                super__Vector_base<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1;
  bVar8 = lVar6 != 0;
  local_58 = _name;
  local_50 = this;
  if (bVar8) {
    uVar7 = lVar6 >> 4;
    local_48 = (_name->_M_dataplus)._M_p;
    __n = _name->_M_string_length;
    uVar5 = 1;
    do {
      unaff_R15 = psVar1;
      peVar2 = (unaff_R15->super___shared_ptr<gutil::PropertyNode,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      if ((__n == (peVar2->name)._M_string_length) &&
         ((__n == 0 || (iVar4 = bcmp(local_48,(peVar2->name)._M_dataplus._M_p,__n), iVar4 == 0))))
      break;
      bVar8 = uVar5 < uVar7;
      lVar6 = (-(ulong)(uVar7 == 0) - uVar7) + uVar5;
      uVar5 = uVar5 + 1;
      psVar1 = unaff_R15 + 1;
    } while (lVar6 != 0);
  }
  pPVar3 = local_50;
  if (!bVar8) {
    this_00 = &local_50->list;
    local_40.super___shared_ptr<gutil::PropertyNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<gutil::PropertyNode,std::allocator<gutil::PropertyNode>,std::__cxx11::string_const&>
              (&local_40.super___shared_ptr<gutil::PropertyNode,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(PropertyNode **)&local_40,(allocator<gutil::PropertyNode> *)&local_59,
               local_58);
    std::
    vector<std::shared_ptr<gutil::PropertyNode>,std::allocator<std::shared_ptr<gutil::PropertyNode>>>
    ::emplace_back<std::shared_ptr<gutil::PropertyNode>>
              ((vector<std::shared_ptr<gutil::PropertyNode>,std::allocator<std::shared_ptr<gutil::PropertyNode>>>
                *)this_00,&local_40);
    if (local_40.super___shared_ptr<gutil::PropertyNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.super___shared_ptr<gutil::PropertyNode,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    unaff_R15 = (pPVar3->list).
                super__Vector_base<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + -1;
  }
  return unaff_R15;
}

Assistant:

std::shared_ptr<PropertyNode> &getChild(const std::string &_name)
    {
      for (size_t i=0; i<list.size(); i++)
      {
        if (_name == list[i]->getName())
        {
          return list[i];
        }
      }

      list.push_back(std::make_shared<PropertyNode>(_name));

      return list.back();
    }